

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall
gulps::gulps_async_file_output::gulps_async_file_output(gulps_async_file_output *this,string *name)

{
  gulps_async_file_output *local_30;
  code *local_28;
  undefined8 local_20;
  
  gulps_file_output::gulps_file_output(&this->super_gulps_file_output,name);
  (this->super_gulps_file_output).super_gulps_output._vptr_gulps_output =
       (_func_int **)&PTR__gulps_async_file_output_00150bc0;
  thdq<gulps::message>::thdq(&this->msg_q);
  local_28 = output_main;
  local_20 = 0;
  local_30 = this;
  std::thread::
  thread<void(gulps::gulps_async_file_output::*)(),gulps::gulps_async_file_output*,void>
            (&this->thd,(type *)&local_28,&local_30);
  return;
}

Assistant:

gulps_async_file_output(const std::string& name) : 
			gulps_file_output(name), thd(&gulps_async_file_output::output_main, this)
		{
		}